

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

bool __thiscall
StaticTaintAnalysisPass::isTainted
          (StaticTaintAnalysisPass *this,Instruction *ins,SmallVector<llvm::Value_*,_0U> *v)

{
  bool bVar1;
  reference ppVVar2;
  iterator ppVVar3;
  iterator local_40;
  iterator it_1;
  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
  local_30;
  iterator it;
  SmallVector<llvm::Value_*,_0U> *v_local;
  Instruction *ins_local;
  StaticTaintAnalysisPass *this_local;
  
  it._M_current = (Value **)v;
  local_30._M_current =
       (Value **)
       std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::begin(&this->taintSource);
  while( true ) {
    it_1 = (iterator)
           std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::end(&this->taintSource);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                        *)&it_1);
    if (!bVar1) {
      local_40 = llvm::SmallVectorTemplateCommon<llvm::Value_*,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::Value_*,_void> *)it._M_current);
      while( true ) {
        ppVVar3 = llvm::SmallVectorTemplateCommon<llvm::Value_*,_void>::end
                            ((SmallVectorTemplateCommon<llvm::Value_*,_void> *)it._M_current);
        if (local_40 == ppVVar3) {
          return false;
        }
        if (ins == (Instruction *)*local_40) break;
        local_40 = local_40 + 1;
      }
      return true;
    }
    ppVVar2 = __gnu_cxx::
              __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
              ::operator*(&local_30);
    if (ins == (Instruction *)*ppVVar2) break;
    __gnu_cxx::
    __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>::
    operator++(&local_30);
  }
  return true;
}

Assistant:

bool
StaticTaintAnalysisPass::isTainted(Instruction *ins, SmallVector<Value *, 0> &v) {
    for ( auto it = taintSource.begin(); it != taintSource.end(); ++it ) {
        if ( ins == *it ) 
            return true ;
    }
    for ( auto it = v.begin(); it != v.end(); ++it ) {
        if ( ins == *it ) 
            return true;
    } 
    return false ;
}